

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

double helics::randDouble(RandomDistributions dist,double param1,double param2)

{
  double dVar1;
  result_type_conflict1 rVar2;
  int iVar3;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  size_t sVar4;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  uniform_real_distribution<double> distribution;
  hash<std::thread::id> local_13c9;
  undefined1 local_13c8 [16];
  double local_13b0;
  id local_13a8;
  anon_union_5000_2_650ea050_for_random_device_0 local_13a0;
  
  local_13c8._8_4_ = in_XMM1_Dc;
  local_13c8._0_8_ = param2;
  local_13c8._12_4_ = in_XMM1_Dd;
  local_13b0 = param1;
  this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)__tls_get_addr(&PTR_004e0d40);
  if ((char)this[1]._M_x[0] == '\0') {
    std::random_device::random_device((random_device *)&local_13a0.field_0);
    iVar3 = std::random_device::_M_getval();
    local_13a8._M_thread = pthread_self();
    sVar4 = std::hash<std::thread::id>::operator()(&local_13c9,&local_13a8);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(this,(ulong)(uint)(iVar3 + (int)sVar4));
    std::random_device::~random_device((random_device *)&local_13a0.field_0);
    *(undefined1 *)this[1]._M_x = 1;
  }
  switch(dist) {
  case UNIFORM:
    local_13a0._0_8_ = local_13b0;
    local_13a0._M_mt._M_x[1] = local_13c8._0_8_;
    local_13b0 = std::uniform_real_distribution<double>::operator()
                           ((uniform_real_distribution<double> *)&local_13a0.field_0,this);
    break;
  case BERNOULLI:
    dVar1 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (this);
    local_13b0 = (double)(-(ulong)(dVar1 < local_13b0) & local_13c8._0_8_);
    break;
  case BINOMIAL:
    std::binomial_distribution<int>::binomial_distribution
              ((binomial_distribution<int> *)&local_13a0.field_0,(int)local_13b0,
               (double)local_13c8._0_8_);
    rVar2 = std::binomial_distribution<int>::operator()
                      ((binomial_distribution<int> *)&local_13a0.field_0,this);
    local_13b0 = (double)rVar2;
    break;
  case GEOMETRIC:
    local_13a0._0_8_ = local_13b0;
    std::geometric_distribution<int>::param_type::_M_initialize((param_type *)&local_13a0.field_0);
    iVar3 = std::geometric_distribution<int>::operator()
                      ((geometric_distribution<int> *)&local_13a0.field_0,this);
    goto LAB_001ce6aa;
  case POISSON:
    std::poisson_distribution<int>::poisson_distribution
              ((poisson_distribution<int> *)&local_13a0.field_0,local_13b0);
    iVar3 = std::poisson_distribution<int>::operator()
                      ((poisson_distribution<int> *)&local_13a0.field_0,this);
LAB_001ce6aa:
    local_13b0 = (double)iVar3 * (double)local_13c8._0_8_;
    break;
  case EXPONENTIAL:
    local_13a0._0_8_ = local_13b0;
    local_13b0 = std::exponential_distribution<double>::operator()
                           ((exponential_distribution<double> *)&local_13a0.field_0,this);
    break;
  case GAMMA:
    std::gamma_distribution<double>::gamma_distribution
              ((gamma_distribution<double> *)&local_13a0.field_0,local_13b0,(double)local_13c8._0_8_
              );
    local_13b0 = std::gamma_distribution<double>::operator()
                           ((gamma_distribution<double> *)&local_13a0.field_0,this);
    break;
  case WEIBULL:
    local_13a0._0_8_ = local_13b0;
    local_13a0._M_mt._M_x[1] = local_13c8._0_8_;
    local_13b0 = std::weibull_distribution<double>::operator()
                           ((weibull_distribution<double> *)&local_13a0.field_0,this);
    break;
  case EXTREME_VALUE:
    local_13a0._0_8_ = local_13b0;
    local_13a0._M_mt._M_x[1] = local_13c8._0_8_;
    local_13b0 = std::extreme_value_distribution<double>::operator()
                           ((extreme_value_distribution<double> *)&local_13a0.field_0,this);
    break;
  case NORMAL:
    local_13a0._0_8_ = local_13b0;
    local_13a0._M_mt._M_x[1] = local_13c8._0_8_;
    local_13a0._M_mt._M_x[2] = 0;
    local_13a0._M_mt._M_x[3]._0_4_ = local_13a0._M_mt._M_x[3]._0_4_ & 0xffffff00;
    local_13b0 = std::normal_distribution<double>::operator()
                           ((normal_distribution<double> *)&local_13a0.field_0,this);
    break;
  case LOGNORMAL:
    local_13a0._0_8_ = local_13b0;
    local_13a0._M_mt._M_x[1] = local_13c8._0_8_;
    local_13a0._M_mt._M_x[2] = 0;
    local_13a0._M_mt._M_x[3]._0_4_ = 0;
    local_13a0._M_mt._M_x[3]._4_4_ = 0x3ff00000;
    local_13a0._M_mt._M_x[4] = 0;
    local_13a0._M_mt._M_x[5]._0_1_ = 0;
    local_13b0 = std::lognormal_distribution<double>::operator()
                           ((lognormal_distribution<double> *)&local_13a0.field_0,this);
    break;
  case CHI_SQUARED:
    std::chi_squared_distribution<double>::chi_squared_distribution
              ((chi_squared_distribution<double> *)&local_13a0.field_0,local_13b0);
    local_13b0 = std::chi_squared_distribution<double>::operator()
                           ((chi_squared_distribution<double> *)&local_13a0.field_0,this);
    break;
  case CAUCHY:
    local_13a0._0_8_ = local_13b0;
    local_13a0._M_mt._M_x[1] = local_13c8._0_8_;
    local_13b0 = std::cauchy_distribution<double>::operator()
                           ((cauchy_distribution<double> *)&local_13a0.field_0,this);
    break;
  case FISHER_F:
    std::fisher_f_distribution<double>::fisher_f_distribution
              ((fisher_f_distribution<double> *)&local_13a0.field_0,local_13b0,
               (double)local_13c8._0_8_);
    local_13b0 = std::fisher_f_distribution<double>::operator()
                           ((fisher_f_distribution<double> *)&local_13a0.field_0,this);
    break;
  case STUDENT_T:
    std::student_t_distribution<double>::student_t_distribution
              ((student_t_distribution<double> *)&local_13a0.field_0,local_13b0);
    local_13b0 = std::student_t_distribution<double>::operator()
                           ((student_t_distribution<double> *)&local_13a0.field_0,this);
  }
  return local_13b0;
}

Assistant:

double randDouble(RandomDistributions dist, double param1, double param2)
{
    static thread_local std::mt19937 generator(
        std::random_device{}() +
        static_cast<unsigned int>(std::hash<std::thread::id>{}(std::this_thread::get_id())));

    switch (dist) {
        case RandomDistributions::CONSTANT:
        default:
            return param1;
        case RandomDistributions::UNIFORM: {
            std::uniform_real_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::NORMAL: {
            std::normal_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::LOGNORMAL: {
            std::lognormal_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::CAUCHY: {
            std::cauchy_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::CHI_SQUARED: {
            std::chi_squared_distribution<double> distribution(param1);
            return distribution(generator);
        }
        case RandomDistributions::EXPONENTIAL: {
            std::exponential_distribution<double> distribution(param1);
            return distribution(generator);
        }
        case RandomDistributions::EXTREME_VALUE: {
            std::extreme_value_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::FISHER_F: {
            std::fisher_f_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::WEIBULL: {
            std::weibull_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::STUDENT_T: {
            std::student_t_distribution<double> distribution(param1);
            return distribution(generator);
        }
        case RandomDistributions::GEOMETRIC: {  // integer multiples of some period
            std::geometric_distribution<int> distribution(param1);
            return distribution(generator) * param2;
        }
        case RandomDistributions::POISSON: {  // integer multiples of some period
            std::poisson_distribution<int> distribution(param1);
            return distribution(generator) * param2;
        }
        case RandomDistributions::BERNOULLI: {
            std::bernoulli_distribution distribution(param1);
            return distribution(generator) ? param2 : 0.0;
        }
        case RandomDistributions::BINOMIAL: {
            std::binomial_distribution<int> distribution(static_cast<int>(param1), param2);
            return static_cast<double>(distribution(generator));
        }
        case RandomDistributions::GAMMA: {
            std::gamma_distribution<double> distribution(param1, param2);
            return distribution(generator);
        } break;
    }

    // return 0.0;
}